

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* streamToEvents_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,TestStream *input,char *eventFormat)

{
  Event *event;
  initializer_list<unsigned_long> __l;
  initializer_list<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_> __l_00;
  PrettyPrinter pp;
  EventStream eventStream;
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  string local_2d8;
  PrettyPrinter local_2b8;
  EventStream local_268;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> local_1a8 [4];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_268,__l,
             (allocator_type *)&local_2b8);
  local_1a8[0].super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8[0].super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = local_1a8;
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::vector(&local_268._eventSources._segments,__l_00,(allocator_type *)&local_2b8);
  std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector(local_1a8);
  local_268._writerProp.name._M_dataplus._M_p = (pointer)&local_268._writerProp.name.field_2;
  local_268._writerProp.id = 0;
  local_268._writerProp.name._M_string_length = 0;
  local_268._writerProp.name.field_2._M_local_buf[0] = '\0';
  local_268._clockSync.tzName._M_dataplus._M_p = (pointer)&local_268._clockSync.tzName.field_2;
  local_268._writerProp.batchSize = 0;
  local_268._clockSync.clockValue = 0;
  local_268._clockSync.clockFrequency = 0;
  local_268._clockSync.nsSinceEpoch = 0;
  local_268._clockSync.tzOffset = 0;
  local_268._clockSync.tzName._M_string_length = 0;
  local_268._clockSync.tzName.field_2._M_local_buf[0] = '\0';
  local_268._event.source = (EventSource *)0x0;
  local_268._event.clockValue = 0;
  local_268._event.arguments._begin = (char *)0x0;
  local_268._event.arguments._end = (char *)0x0;
  std::__cxx11::string::string((string *)&local_2d8,eventFormat,(allocator *)local_1a8);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"%Y.%m.%d %H:%M:%S","");
  binlog::PrettyPrinter::PrettyPrinter(&local_2b8,&local_2d8,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  do {
    event = binlog::EventStream::nextEvent(&local_268,&input->super_EntryStream);
    if (event == (Event *)0x0) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    binlog::PrettyPrinter::printEvent
              (&local_2b8,(ostream *)local_1a8,event,&local_268._writerProp,&local_268._clockSync);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  } while (event != (Event *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._timeFormat._M_dataplus._M_p != &local_2b8._timeFormat.field_2) {
    operator_delete(local_2b8._timeFormat._M_dataplus._M_p,
                    local_2b8._timeFormat.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._eventFormat._M_dataplus._M_p != &local_2b8._eventFormat.field_2) {
    operator_delete(local_2b8._eventFormat._M_dataplus._M_p,
                    local_2b8._eventFormat.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._clockSync.tzName._M_dataplus._M_p != &local_268._clockSync.tzName.field_2) {
    operator_delete(local_268._clockSync.tzName._M_dataplus._M_p,
                    CONCAT71(local_268._clockSync.tzName.field_2._M_allocated_capacity._1_7_,
                             local_268._clockSync.tzName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._writerProp.name._M_dataplus._M_p != &local_268._writerProp.name.field_2) {
    operator_delete(local_268._writerProp.name._M_dataplus._M_p,
                    CONCAT71(local_268._writerProp.name.field_2._M_allocated_capacity._1_7_,
                             local_268._writerProp.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::~vector(&local_268._eventSources._segments);
  if (local_268._eventSources._offsets.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268._eventSources._offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> streamToEvents(TestStream& input, const char* eventFormat)
{
  std::vector<std::string> result;

  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(eventFormat, "%Y.%m.%d %H:%M:%S");

  while (const binlog::Event* event = eventStream.nextEvent(input))
  {
    std::ostringstream str;
    pp.printEvent(str, *event, eventStream.writerProp(), eventStream.clockSync());
    result.push_back(str.str());
  }

  return result;
}